

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_min_bary(REF_INTERP ref_interp,REF_DBL *min_bary)

{
  int iVar1;
  REF_MPI ref_mpi;
  REF_GRID pRVar2;
  REF_NODE pRVar3;
  REF_GLOB *pRVar4;
  REF_DBL *pRVar5;
  uint uVar6;
  undefined8 uVar7;
  long lVar8;
  char *pcVar9;
  double dVar10;
  REF_DBL local_20;
  
  ref_mpi = ref_interp->ref_mpi;
  pRVar2 = ref_interp->to_grid;
  pRVar3 = pRVar2->node;
  *min_bary = 1.0;
  iVar1 = pRVar3->max;
  if ((long)iVar1 < 1) {
    local_20 = 1.0;
  }
  else {
    pRVar4 = pRVar3->global;
    local_20 = 1.0;
    lVar8 = 0;
    do {
      if ((-1 < *(long *)((long)pRVar4 + lVar8 * 2)) &&
         (pRVar3->ref_mpi->id == *(int *)((long)pRVar3->part + lVar8))) {
        if (*(int *)((long)ref_interp->cell + lVar8) == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x925,"ref_interp_min_bary","node needs to be localized");
          return 1;
        }
        pRVar5 = ref_interp->bary;
        dVar10 = pRVar5[lVar8];
        if (pRVar5[lVar8 + 1] <= pRVar5[lVar8]) {
          dVar10 = pRVar5[lVar8 + 1];
        }
        if (pRVar5[lVar8 + 2] <= dVar10) {
          dVar10 = pRVar5[lVar8 + 2];
        }
        if ((pRVar2->twod == 0) && (pRVar5[lVar8 + 3] <= dVar10)) {
          dVar10 = pRVar5[lVar8 + 3];
        }
        if (dVar10 <= local_20) {
          local_20 = dVar10;
        }
        *min_bary = local_20;
      }
      lVar8 = lVar8 + 4;
    } while ((long)iVar1 * 4 != lVar8);
  }
  uVar6 = ref_mpi_min(ref_mpi,&local_20,min_bary,3);
  if (uVar6 == 0) {
    uVar6 = ref_mpi_bcast(ref_mpi,min_bary,1,3);
    if (uVar6 == 0) {
      return 0;
    }
    pcVar9 = "bcast";
    uVar7 = 0x931;
  }
  else {
    pcVar9 = "min";
    uVar7 = 0x930;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar7,
         "ref_interp_min_bary",(ulong)uVar6,pcVar9);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_interp_min_bary(REF_INTERP ref_interp,
                                       REF_DBL *min_bary) {
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_INT node;
  REF_DBL this_bary;

  *min_bary = 1.0;

  each_ref_node_valid_node(to_node, node) if (ref_node_owned(to_node, node)) {
    RUS(REF_EMPTY, ref_interp->cell[node], "node needs to be localized");

    this_bary =
        MIN(MIN(ref_interp->bary[0 + 4 * node], ref_interp->bary[1 + 4 * node]),
            ref_interp->bary[2 + 4 * node]);
    if (!ref_grid_twod(to_grid)) {
      this_bary = MIN(this_bary, ref_interp->bary[3 + 4 * node]);
    }
    *min_bary = MIN(*min_bary, this_bary);
  }
  this_bary = *min_bary;
  RSS(ref_mpi_min(ref_mpi, &this_bary, min_bary, REF_DBL_TYPE), "min");
  RSS(ref_mpi_bcast(ref_mpi, min_bary, 1, REF_DBL_TYPE), "bcast");

  return REF_SUCCESS;
}